

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

int collectWindowBeginSignalWithDSC(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  char *pcVar1;
  long lVar2;
  
  if (0 < pAig->nTruePos) {
    lVar2 = 0;
    do {
      if ((pAig->vCos->nSize <= lVar2) || (pNtk->vPos->nSize <= lVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pcVar1 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[lVar2]);
      pcVar1 = strstr(pcVar1,"windowBegins_");
      if (pcVar1 != (char *)0x0) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pAig->nTruePos);
  }
  return -1;
}

Assistant:

int collectWindowBeginSignalWithDSC( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
	int i;
	Aig_Obj_t *pObj;

	Saig_ManForEachPo( pAig, pObj, i )
	{
		if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "windowBegins_" ) != NULL )
		{
			return i;			
		}
	}
	
	return -1;
}